

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_set_recall_depth(player *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  short sVar3;
  
  if (((p->opts).opt[0x20] == true) && ((int)p->max_depth < (uint)z_info->max_depth + L'\xffffffff')
     ) {
    _Var1 = is_quest(p,(int)p->max_depth);
    if (!_Var1) {
      wVar2 = dungeon_get_next_level(p,(int)p->max_depth,L'\x01');
      p->recall_depth = (int16_t)wVar2;
    }
  }
  sVar3 = 1;
  if (1 < p->recall_depth) {
    sVar3 = p->recall_depth;
  }
  p->recall_depth = sVar3;
  return;
}

Assistant:

void player_set_recall_depth(struct player *p)
{
	/* Account for forced descent */
	if (OPT(p, birth_force_descend)) {
		/* Force descent to a lower level if allowed */
		if (p->max_depth < z_info->max_depth - 1
				&& !is_quest(p, p->max_depth)) {
			p->recall_depth = dungeon_get_next_level(p,
				p->max_depth, 1);
		}
	}

	/* Players who haven't left town before go to level 1 */
	p->recall_depth = MAX(p->recall_depth, 1);
}